

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface_var_sroa.cpp
# Opt level: O3

void __thiscall
spvtools::opt::InterfaceVariableScalarReplacement::CloneAnnotationForVariable
          (InterfaceVariableScalarReplacement *this,Instruction *annotation_inst,uint32_t var_id)

{
  Op OVar1;
  pointer pOVar2;
  IRContext *pIVar3;
  Analysis AVar4;
  Instruction *inst;
  ulong uVar5;
  ulong uVar6;
  undefined1 local_50 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_30;
  
  OVar1 = annotation_inst->opcode_;
  if (((OVar1 != OpDecorate) && (OVar1 != OpDecorateId)) && (OVar1 != OpDecorateString)) {
    __assert_fail("annotation_inst->opcode() == spv::Op::OpDecorate || annotation_inst->opcode() == spv::Op::OpDecorateId || annotation_inst->opcode() == spv::Op::OpDecorateString"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/interface_var_sroa.cpp"
                  ,0x227,
                  "void spvtools::opt::InterfaceVariableScalarReplacement::CloneAnnotationForVariable(Instruction *, uint32_t)"
                 );
  }
  inst = Instruction::Clone(annotation_inst,(this->super_Pass).context_);
  local_50._24_8_ = local_50 + 0x10;
  local_50._0_8_ = &PTR__SmallVector_00930a20;
  local_30._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
  local_50._8_8_ = 1;
  uVar5 = (ulong)(inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar5 = (ulong)inst->has_result_id_;
  }
  pOVar2 = (inst->operands_).
           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = ((long)(inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar2 >> 4) *
          -0x5555555555555555;
  local_50._16_4_ = var_id;
  if (uVar5 <= uVar6 && uVar6 - uVar5 != 0) {
    utils::SmallVector<unsigned_int,_2UL>::operator=
              ((SmallVector<unsigned_int,_2UL> *)
               ((long)((pOVar2->words).buffer + 0xfffffffffffffffc) +
               (ulong)(uint)((int)uVar5 * 0x30)),(SmallVector<unsigned_int,_2UL> *)local_50);
    local_50._0_8_ = &PTR__SmallVector_00930a20;
    if (local_30._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
      std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                 &local_30,local_30._M_head_impl);
    }
    pIVar3 = (this->super_Pass).context_;
    AVar4 = pIVar3->valid_analyses_;
    if ((AVar4 & kAnalysisDecorations) != kAnalysisNone) {
      analysis::DecorationManager::AddDecoration
                ((pIVar3->decoration_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DecorationManager,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DecorationManager_*,_std::default_delete<spvtools::opt::analysis::DecorationManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DecorationManager_*,_false>.
                 _M_head_impl,inst);
      AVar4 = pIVar3->valid_analyses_;
    }
    if ((AVar4 & kAnalysisBegin) != kAnalysisNone) {
      analysis::DefUseManager::AnalyzeInstDefUse
                ((pIVar3->def_use_mgr_)._M_t.
                 super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                 .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                 _M_head_impl,inst);
    }
    utils::IntrusiveList<spvtools::opt::Instruction>::push_back
              (&(((pIVar3->module_)._M_t.
                  super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
                  .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl)->annotations_
                ).super_IntrusiveList<spvtools::opt::Instruction>,inst);
    return;
  }
  __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/instruction.h"
                ,0x2b8,
                "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)");
}

Assistant:

void InterfaceVariableScalarReplacement::CloneAnnotationForVariable(
    Instruction* annotation_inst, uint32_t var_id) {
  assert(annotation_inst->opcode() == spv::Op::OpDecorate ||
         annotation_inst->opcode() == spv::Op::OpDecorateId ||
         annotation_inst->opcode() == spv::Op::OpDecorateString);
  std::unique_ptr<Instruction> new_inst(annotation_inst->Clone(context()));
  new_inst->SetInOperand(0, {var_id});
  context()->AddAnnotationInst(std::move(new_inst));
}